

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioutils.cpp
# Opt level: O1

QString * QMakeInternal::IoUtils::shellQuoteWin(QString *__return_storage_ptr__,QString *arg)

{
  char16_t cVar1;
  Data *pDVar2;
  bool bVar3;
  int *piVar4;
  QArrayData *pQVar5;
  char16_t *pcVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long in_FS_OFFSET;
  bool bVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  QRegularExpression local_50 [8];
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar9 = (arg->d).size;
  if (lVar9 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QVar16.m_data = (storage_type *)0x2;
      QVar16.m_size = (qsizetype)__return_storage_ptr__;
      QString::fromLatin1(QVar16);
      return __return_storage_ptr__;
    }
  }
  else {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pDVar2 = (arg->d).d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (arg->d).ptr;
    (__return_storage_ptr__->d).size = lVar9;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    uVar7 = (int)(__return_storage_ptr__->d).size - 1;
    bVar11 = -1 < (int)uVar7;
    if (bVar11) {
      pcVar6 = (__return_storage_ptr__->d).ptr;
      if (pcVar6 == (char16_t *)0x0) {
        pcVar6 = (char16_t *)&QString::_empty;
      }
      bVar11 = true;
      lVar9 = (ulong)uVar7 + 1;
      do {
        cVar1 = pcVar6[lVar9 + -1];
        if (((ushort)cVar1 < 0x80) &&
           ((shellQuoteWin::iqm[(ushort)cVar1 >> 3] >> (cVar1 & 7U) & 1) != 0)) break;
        bVar11 = lVar9 != 1 && -1 < lVar9 + -1;
        lVar8 = lVar9 + -1;
        bVar3 = 0 < lVar9;
        lVar9 = lVar8;
      } while (lVar8 != 0 && bVar3);
    }
    if (bVar11) {
      QVar12.m_data = (storage_type *)0x6;
      QVar12.m_size = (qsizetype)&local_48;
      QString::fromLatin1(QVar12);
      local_68 = local_48;
      uStack_64 = uStack_44;
      uStack_60 = uStack_40;
      uStack_5c = uStack_3c;
      local_58 = local_38;
      QRegularExpression::QRegularExpression(local_50,&local_68,0);
      QVar13.m_data = (storage_type *)0x6;
      QVar13.m_size = (qsizetype)&local_48;
      QString::fromLatin1(QVar13);
      pQVar5 = (QArrayData *)CONCAT44(uStack_44,local_48);
      QString::replace((QRegularExpression *)__return_storage_ptr__,(QString *)local_50);
      if (pQVar5 != (QArrayData *)0x0) {
        LOCK();
        (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar5,2,0x10);
        }
      }
      QRegularExpression::~QRegularExpression(local_50);
      piVar4 = (int *)CONCAT44(uStack_64,local_68);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_64,local_68),2,0x10);
        }
      }
      QVar14.m_data = (storage_type *)0x6;
      QVar14.m_size = (qsizetype)&local_48;
      QString::fromLatin1(QVar14);
      local_68 = local_48;
      uStack_64 = uStack_44;
      uStack_60 = uStack_40;
      uStack_5c = uStack_3c;
      local_58 = local_38;
      QRegularExpression::QRegularExpression(local_50,&local_68,0);
      QVar15.m_data = (storage_type *)0x4;
      QVar15.m_size = (qsizetype)&local_48;
      QString::fromLatin1(QVar15);
      pQVar5 = (QArrayData *)CONCAT44(uStack_44,local_48);
      QString::replace((QRegularExpression *)__return_storage_ptr__,(QString *)local_50);
      if (pQVar5 != (QArrayData *)0x0) {
        LOCK();
        (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar5,2,0x10);
        }
      }
      QRegularExpression::~QRegularExpression(local_50);
      piVar4 = (int *)CONCAT44(uStack_64,local_68);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_64,local_68),2,0x10);
        }
      }
      if ((__return_storage_ptr__->d).size != 0) {
        bVar11 = true;
        lVar9 = 0;
        iVar10 = 0;
        do {
          pcVar6 = (__return_storage_ptr__->d).ptr;
          if (pcVar6 == (char16_t *)0x0) {
            pcVar6 = (char16_t *)&QString::_empty;
          }
          cVar1 = pcVar6[lVar9];
          if (cVar1 == L'\"') {
            bVar11 = (bool)(bVar11 ^ 1);
          }
          else if (((ushort)cVar1 < 0x80 && !bVar11) &&
                  ((""[(ushort)cVar1 >> 3] >> (cVar1 & 7U) & 1) != 0)) {
            iVar10 = iVar10 + 1;
            QString::insert((longlong)__return_storage_ptr__,(QChar)(char16_t)lVar9);
          }
          iVar10 = iVar10 + 1;
          lVar9 = (long)iVar10;
        } while (lVar9 < (__return_storage_ptr__->d).size);
        if (!bVar11) {
          QString::append((QChar)(char16_t)__return_storage_ptr__);
        }
      }
      QString::append((QChar)(char16_t)__return_storage_ptr__);
      QString::insert((longlong)__return_storage_ptr__,(QChar)0x0);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QString IoUtils::shellQuoteWin(const QString &arg)
{
    // Chars that should be quoted (TM). This includes:
    // - control chars & space
    // - the shell meta chars "&()<>^|
    // - the potential separators ,;=
    static const uchar iqm[] = {
        0xff, 0xff, 0xff, 0xff, 0x45, 0x13, 0x00, 0x78,
        0x00, 0x00, 0x00, 0x40, 0x00, 0x00, 0x00, 0x10
    };
    // Shell meta chars that need escaping.
    static const uchar ism[] = {
        0x00, 0x00, 0x00, 0x00, 0x40, 0x03, 0x00, 0x50,
        0x00, 0x00, 0x00, 0x40, 0x00, 0x00, 0x00, 0x10
    }; // &()<>^|

    if (!arg.size())
        return QString::fromLatin1("\"\"");

    QString ret(arg);
    if (hasSpecialChars(ret, iqm)) {
        // The process-level standard quoting allows escaping quotes with backslashes (note
        // that backslashes don't escape themselves, unless they are followed by a quote).
        // Consequently, quotes are escaped and their preceding backslashes are doubled.
        ret.replace(QRegularExpression(QLatin1String("(\\\\*)\"")), QLatin1String("\\1\\1\\\""));
        // Trailing backslashes must be doubled as well, as they are followed by a quote.
        ret.replace(QRegularExpression(QLatin1String("(\\\\+)$")), QLatin1String("\\1\\1"));
        // However, the shell also interprets the command, and no backslash-escaping exists
        // there - a quote always toggles the quoting state, but is nonetheless passed down
        // to the called process verbatim. In the unquoted state, the circumflex escapes
        // meta chars (including itself and quotes), and is removed from the command.
        bool quoted = true;
        for (int i = 0; i < ret.size(); i++) {
            QChar c = ret.unicode()[i];
            if (c.unicode() == '"')
                quoted = !quoted;
            else if (!quoted && isSpecialChar(c.unicode(), ism))
                ret.insert(i++, QLatin1Char('^'));
        }
        if (!quoted)
            ret.append(QLatin1Char('^'));
        ret.append(QLatin1Char('"'));
        ret.prepend(QLatin1Char('"'));
    }
    return ret;
}